

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_ClassArray<ON_HatchLine>::Append(ON_ClassArray<ON_HatchLine> *this,int count,ON_HatchLine *p)

{
  ON_HatchLine *pOVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  double *pdVar5;
  uint uVar6;
  ON_SimpleArray<double> *src;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  if (p != (ON_HatchLine *)0x0 && 0 < count) {
    iVar2 = this->m_count;
    uVar6 = iVar2 + count;
    if (this->m_capacity < (int)uVar6) {
      if (iVar2 < 8 || (ulong)((long)iVar2 << 6) < 0x10000001) {
        uVar8 = 4;
        if (2 < iVar2) {
          uVar8 = iVar2 * 2;
        }
      }
      else {
        iVar7 = 0x400008;
        if (iVar2 < 0x400008) {
          iVar7 = iVar2;
        }
        uVar8 = iVar7 + iVar2;
      }
      if ((int)uVar6 < (int)uVar8) {
        uVar6 = uVar8;
      }
      if ((uint)this->m_capacity < uVar6) {
        SetCapacity(this,(long)(int)uVar6);
      }
    }
    uVar9 = 1;
    if (1 < count) {
      uVar9 = (ulong)(uint)count;
    }
    src = &p->m_dashes;
    do {
      iVar2 = this->m_count;
      this->m_count = iVar2 + 1;
      pOVar1 = this->m_a + iVar2;
      (pOVar1->m_offset).y = *(double *)&src[-1].m_count;
      pdVar3 = src[-2].m_a;
      dVar4 = *(double *)&src[-2].m_count;
      pdVar5 = src[-1].m_a;
      (pOVar1->m_base).y = (double)src[-1]._vptr_ON_SimpleArray;
      (pOVar1->m_offset).x = (double)pdVar5;
      pOVar1->m_angle_radians = (double)pdVar3;
      (pOVar1->m_base).x = dVar4;
      ON_SimpleArray<double>::operator=(&pOVar1->m_dashes,src);
      src = (ON_SimpleArray<double> *)&src[2].m_count;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void ON_ClassArray<T>::Append( int count, const T* p ) 
{
  int i;
  if ( count > 0 && p ) 
  {
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      Reserve( newcapacity );
    }
    for ( i = 0; i < count; i++ ) {
      m_a[m_count++] = p[i];
    }
  }
}